

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall
libchars::command::command
          (command *this,string *cmd_str_,char *name_,filter_t mask_,id_t ID_,bool hidden_)

{
  bool hidden__local;
  id_t ID__local;
  filter_t mask__local;
  char *name__local;
  string *cmd_str__local;
  command *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->ID = ID_;
  std::__cxx11::string::string((string *)&this->cmd_str,(string *)cmd_str_);
  std::__cxx11::string::string((string *)&this->help);
  std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::vector(&this->par);
  this->mask = mask_;
  this->hidden = hidden_;
  this->next = (command *)0x0;
  if (name_ != (char *)0x0) {
    std::__cxx11::string::assign((char *)this);
  }
  return;
}

Assistant:

command::command(const std::string &cmd_str_, const char *name_, filter_t mask_, token::id_t ID_, bool hidden_) :
        ID(ID_),cmd_str(cmd_str_),mask(mask_),hidden(hidden_),next(NULL)
    {
        if (name_ != NULL)
            name.assign(name_);
    }